

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<char_const(&)[28],char*&,char_const(&)[15],int_const&>
          (string *__return_storage_ptr__,util *this,char (*args) [28],char **args_1,
          char (*args_2) [15],int *args_3)

{
  ostringstream ss;
  ostringstream aoStack_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_1a8);
  std::operator<<((ostream *)aoStack_1a8,(char *)this);
  std::operator<<((ostream *)aoStack_1a8,*(char **)*args);
  std::operator<<((ostream *)aoStack_1a8,(char *)args_1);
  std::ostream::operator<<(aoStack_1a8,*(int *)*args_2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}